

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFDebugNames::NameIndex::dumpEntry(NameIndex *this,ScopedPrinter *W,uint64_t *Offset)

{
  undefined8 *puVar1;
  StringRef N;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  char cVar4;
  storage_type *this_00;
  byte bVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined1 local_188 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  uint64_t local_b0;
  uint64_t EntryId;
  Child local_90 [3];
  string local_78;
  anon_class_8_1_54a397f7 local_58;
  undefined1 local_50 [24];
  DictScope EntryScope;
  
  local_b0 = *Offset;
  getEntry((Expected<llvm::DWARFDebugNames::Entry> *)local_188,this,Offset);
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    Twine::Twine((Twine *)&EntryOr.field_0xb8,"Entry @ 0x");
    Twine::utohexstr((Twine *)local_90,&local_b0);
    Twine::concat((Twine *)&EntryId,(Twine *)&EntryOr.field_0xb8,(Twine *)local_90);
    Twine::str_abi_cxx11_(&local_78,(Twine *)&EntryId);
    N.Length = local_78._M_string_length;
    N.Data = local_78._M_dataplus._M_p;
    DelimitedScope<'{',_'}'>::DelimitedScope((DelimitedScope<___,____> *)(local_50 + 0x10),W,N);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = Expected<llvm::DWARFDebugNames::Entry>::getStorage
                        ((Expected<llvm::DWARFDebugNames::Entry> *)local_188);
    DWARFDebugNames::Entry::dump(this_00,W);
    DelimitedScope<'{',_'}'>::~DelimitedScope((DelimitedScope<___,____> *)(local_50 + 0x10));
  }
  else {
    Expected<llvm::DWARFDebugNames::Entry>::takeError
              ((Expected<llvm::DWARFDebugNames::Entry> *)local_50);
    uVar3 = local_50._0_8_;
    local_50[0] = '\0';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    plVar7 = (long *)(uVar3 & 0xfffffffffffffffe);
    bVar5 = EntryOr.field_0.TStorage.buffer[0xb0];
    local_58.W = W;
    if (plVar7 == (long *)0x0) {
      local_50._16_8_ = 1;
    }
    else {
      cVar4 = (**(code **)(*plVar7 + 0x30))(plVar7);
      if (cVar4 == '\0') {
        local_78._M_dataplus._M_p = (pointer)plVar7;
        handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
                  ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                   (local_50 + 0x10),(anon_class_1_0_00000001 *)&local_78,&local_58);
        if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
        }
      }
      else {
        EntryScope.W._7_1_ = EntryOr.field_0.TStorage.buffer[0xb0];
        puVar1 = (undefined8 *)plVar7[2];
        local_50._16_8_ = 1;
        local_50._8_8_ = plVar7;
        for (puVar6 = (undefined8 *)plVar7[1]; puVar6 != puVar1; puVar6 = puVar6 + 1) {
          local_90[0].twine = (Twine *)*puVar6;
          *puVar6 = 0;
          EntryId = local_50._16_8_;
          handleErrorImpl<llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__0,llvm::DWARFDebugNames::NameIndex::dumpEntry(llvm::ScopedPrinter&,unsigned_long*)const::__1>
                    ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &EntryOr.field_0xb8,(anon_class_1_0_00000001 *)&local_90[0].character,&local_58
                    );
          ErrorList::join((ErrorList *)&local_78,(Error *)&EntryId,(Error *)&EntryOr.field_0xb8);
          _Var2._M_p = local_78._M_dataplus._M_p;
          local_78._M_dataplus._M_p = (pointer)0x0;
          if ((long *)(EntryOr._184_8_ & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)(EntryOr._184_8_ & 0xfffffffffffffffe) + 8))();
          }
          if (local_90[0].twine != (Twine *)0x0) {
            (**(code **)(*local_90[0].decUL + 8))();
          }
          local_90[0].twine = (Twine *)0x0;
          if ((long *)(EntryId & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)(EntryId & 0xfffffffffffffffe) + 8))();
          }
          local_50._16_8_ = (ulong)_Var2._M_p | 1;
        }
        (**(code **)(*(long *)local_50._8_8_ + 8))();
        bVar5 = EntryScope.W._7_1_;
      }
    }
    cantFail((Error *)(local_50 + 0x10),(char *)0x0);
    if ((long *)(local_50._16_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_50._16_8_ & 0xfffffffffffffffe) + 8))();
    }
    EntryOr.field_0.TStorage.buffer[0xb0] = bVar5;
    if ((long *)(local_50._0_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_50._0_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  Expected<llvm::DWARFDebugNames::Entry>::~Expected
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_188);
  return (bool)(~EntryOr.field_0.TStorage.buffer[0xb0] & 1);
}

Assistant:

bool DWARFDebugNames::NameIndex::dumpEntry(ScopedPrinter &W,
                                           uint64_t *Offset) const {
  uint64_t EntryId = *Offset;
  auto EntryOr = getEntry(Offset);
  if (!EntryOr) {
    handleAllErrors(EntryOr.takeError(), [](const SentinelError &) {},
                    [&W](const ErrorInfoBase &EI) { EI.log(W.startLine()); });
    return false;
  }

  DictScope EntryScope(W, ("Entry @ 0x" + Twine::utohexstr(EntryId)).str());
  EntryOr->dump(W);
  return true;
}